

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O2

void __thiscall
supermap::Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::
dropRamIndexToDisk(Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *this)

{
  SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>
  *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined1 local_c8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  string local_b0;
  vector<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>_>
  newBlockKeyIndex;
  _Function_base local_78;
  IndexStorageBase newBlock;
  
  iVar2 = (*(((this->innerStorage_)._M_t.
              super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
              .
              super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
             ._M_head_impl)->
            super_KeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>).
            _vptr_KeyValueStorage[3])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    (*(((this->innerStorage_)._M_t.
        super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
        .
        super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
       ._M_head_impl)->super_KeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>).
      _vptr_KeyValueStorage[6])(&newBlockKeyIndex);
    Supermap<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>::
    getNewBlockName_abi_cxx11_(&local_b0,this);
    SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
    ::getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
                      *)(local_c8 + 8));
    std::
    function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>>>()>
    ::
    function<std::function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,supermap::Key<128ul>>,std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,supermap::Key<128ul>>>>()>&,void>
              ((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>>>()>
                *)&local_78,&this->registerSupplier_);
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>,supermap::Key<128ul>>
    ::
    SortedSingleFileIndexedStorage<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>>>>,supermap::Supermap<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>::dropRamIndexToDisk()::_lambda(supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const&,supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const&)_1_,supermap::Supermap<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>::dropRamIndexToDisk()::_lambda(supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const&,supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const&)_2_>
              ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>,supermap::Key<128ul>>
                *)&newBlock,
               newBlockKeyIndex.
               super__Vector_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               newBlockKeyIndex.
               super__Vector_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,1,&local_b0,local_c8 + 8,&local_78);
    std::_Function_base::~_Function_base(&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
    std::__cxx11::string::~string((string *)&local_b0);
    pSVar1 = (this->diskIndex_)._M_t.
             super___uniq_ptr_impl<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_*,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_>
             .
             super__Head_base<0UL,_supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_*,_false>
             ._M_head_impl;
    std::
    function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_&&)>
    ::operator()((function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_&&)>
                  *)local_c8,
                 (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>
                  *)&this->keyIndexStorageSupplier_);
    (**(pSVar1->
       super_OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_unsigned_long,_void>
       )._vptr_OrderedStorage)
              (&pSVar1->
                super_OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_unsigned_long,_void>
               ,local_c8);
    if ((long *)local_c8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 0x18))();
    }
    SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
    ::~SingleFileIndexedStorage
              (&newBlock.
                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
              );
    std::
    _Vector_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>_>
    ::~_Vector_base(&newBlockKeyIndex.
                     super__Vector_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>_>
                   );
  }
  return;
}

Assistant:

void dropRamIndexToDisk() {
        if (innerStorage_->getUpperSizeBound() == 0) {
            return;
        }
        std::vector<KeyIndex> newBlockKeyIndex = std::move(*innerStorage_).extract();
        auto newBlock = IndexStorageBase(
            newBlockKeyIndex.begin(),
            newBlockKeyIndex.end(),
            true,
            getNewBlockName(),
            diskDataStorage_->getFileManager(),
            [](const KeyIndex &a, const KeyIndex &b) { return a.key < b.key; },
            [](const KeyIndex &a, const KeyIndex &b) { return a.key == b.key; },
            registerSupplier_
        );
        diskIndex_->append(keyIndexStorageSupplier_(std::move(newBlock)));
    }